

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O3

bool __thiscall Memory::HeapBlockMap32::OOMRescan(HeapBlockMap32 *this,Recycler *recycler)

{
  HeapInfoManager *this_00;
  HeapBlockType HVar1;
  L2MapChunk *pLVar2;
  HeapBlock *pHVar3;
  PageAllocatorBaseCommon *pPVar4;
  size_t sVar5;
  L2MapChunk *chunk;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *heapBlock;
  code *pcVar6;
  byte bVar7;
  bool bVar8;
  int iVar9;
  undefined4 *puVar10;
  undefined4 extraout_var;
  IdleDecommitPageAllocator *pIVar11;
  ulong uVar12;
  ulong uVar13;
  Segment *pSVar14;
  char *pcVar15;
  uint lineNumber;
  long lVar16;
  Segment *pSVar17;
  char *pcVar18;
  IdleDecommitPageAllocator *pageAllocator;
  long lVar19;
  char *pcVar20;
  char *pcVar21;
  HeapInfo *this_01;
  
  this->anyHeapBlockRescannedDuringOOM = false;
  puVar10 = (undefined4 *)__tls_get_addr();
  this_00 = &recycler->autoHeap;
  bVar7 = 1;
  lVar19 = 0;
  pSVar14 = (Segment *)0x0;
  do {
    pLVar2 = this->map[lVar19];
    if (pLVar2 != (L2MapChunk *)0x0) {
      lVar16 = 0;
      do {
        pHVar3 = pLVar2->map[lVar16];
        if (pHVar3 != (HeapBlock *)0x0) {
          pSVar17 = pHVar3->segment;
          if (pSVar17 == (Segment *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                               ,0x240,"(block->GetSegment() != nullptr)",
                               "block->GetSegment() != nullptr");
            if (!bVar8) goto LAB_006b5eaf;
            *puVar10 = 0;
            pSVar17 = pHVar3->segment;
          }
          if (pSVar17 == pSVar14) {
            if (pSVar14 == (Segment *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x243,"(currentSegment != nullptr)","currentSegment != nullptr");
              if (!bVar8) goto LAB_006b5eaf;
              *puVar10 = 0;
            }
            if ((pHVar3->address < pSVar14->address) ||
               (pSVar14->address +
                (pSVar14->segmentPageCount - (ulong)pSVar14->secondaryAllocPageCount) * 0x1000 <=
                pHVar3->address)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x244,"(currentSegment->IsInSegment(block->GetAddress()))",
                                 "currentSegment->IsInSegment(block->GetAddress())");
joined_r0x006b59e2:
              if (!bVar8) {
LAB_006b5eaf:
                pcVar6 = (code *)invalidInstructionException();
                (*pcVar6)();
              }
              *puVar10 = 0;
            }
          }
          else {
            if (pSVar14 != (Segment *)0x0) {
              if ((pSVar14->address <= pHVar3->address) &&
                 (pHVar3->address <
                  pSVar14->address +
                  (pSVar14->segmentPageCount - (ulong)pSVar14->secondaryAllocPageCount) * 0x1000)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar10 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                   ,0x249,
                                   "(currentSegment == nullptr || !currentSegment->IsInSegment(block->GetAddress()))"
                                   ,
                                   "currentSegment == nullptr || !currentSegment->IsInSegment(block->GetAddress())"
                                  );
                if (!bVar8) goto LAB_006b5eaf;
                *puVar10 = 0;
                pSVar17 = pHVar3->segment;
              }
            }
            pSVar14 = pSVar17;
            if (pSVar14 == (Segment *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x24b,"(currentSegment != nullptr)","currentSegment != nullptr");
              if (!bVar8) goto LAB_006b5eaf;
              *puVar10 = 0;
            }
            pPVar4 = (pSVar14->super_SegmentBaseCommon).allocator;
            pcVar15 = pSVar14->address;
            sVar5 = pSVar14->segmentPageCount;
            pageAllocator = (IdleDecommitPageAllocator *)&pPVar4[-1].allocatorType;
            if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
              pageAllocator = (IdleDecommitPageAllocator *)0x0;
            }
            iVar9 = (*pHVar3->_vptr_HeapBlock[5])(pHVar3);
            this_01 = (HeapInfo *)CONCAT44(extraout_var,iVar9);
            HVar1 = pHVar3->heapBlockType;
            if (HVar1 < 0xc) {
              if ((0x630U >> (HVar1 & 0x1f) & 1) == 0) {
                if ((0x84U >> (HVar1 & 0x1f) & 1) == 0) {
                  if (HVar1 != 0xb) goto LAB_006b5a17;
                  pIVar11 = HeapInfo::GetRecyclerLargeBlockPageAllocator(this_01);
                }
                else {
                  pIVar11 = HeapInfo::GetRecyclerLeafPageAllocator(this_01);
                }
              }
              else {
                pIVar11 = HeapInfo::GetRecyclerWithBarrierPageAllocator(this_01);
              }
            }
            else {
LAB_006b5a17:
              pIVar11 = HeapInfo::GetRecyclerPageAllocator(this_01);
            }
            if (pageAllocator != pIVar11) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x251,
                                 "(segmentPageAllocator == block->GetPageAllocator(block->GetHeapInfo()))"
                                 ,
                                 "segmentPageAllocator == block->GetPageAllocator(block->GetHeapInfo())"
                                );
              if (!bVar8) goto LAB_006b5eaf;
              *puVar10 = 0;
            }
            pcVar20 = (char *)(sVar5 * 0x1000);
            pcVar21 = this->startAddress;
            if (pcVar15 < pcVar21) {
              if (pcVar20 <= pcVar21 + -(long)pcVar15) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar10 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                   ,600,
                                   "(segmentLength > (size_t)(this->startAddress - segmentStart))",
                                   "segmentLength > (size_t)(this->startAddress - segmentStart)");
                if (!bVar8) goto LAB_006b5eaf;
                *puVar10 = 0;
                pcVar21 = this->startAddress;
              }
              pcVar20 = pcVar15 + ((long)pcVar20 - (long)pcVar21);
              pcVar15 = pcVar21;
            }
            pcVar18 = (char *)(0x100000000 - ((long)pcVar15 - (long)pcVar21));
            if (pcVar20 + ((long)pcVar15 - (long)pcVar21) < (char *)0x100000001) {
              pcVar18 = pcVar20;
            }
            if (((ulong)pcVar18 & 0xfff) != 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                 ,0x3e1,"(segmentLength % AutoSystemInfo::PageSize == 0)",
                                 "segmentLength % AutoSystemInfo::PageSize == 0");
              if (!bVar8) goto LAB_006b5eaf;
              *puVar10 = 0;
            }
            bVar8 = HeapInfoManager::IsRecyclerPageAllocator
                              (this_00,&pageAllocator->super_PageAllocator);
            if ((bVar8) ||
               (bVar8 = HeapInfoManager::IsRecyclerWithBarrierPageAllocator
                                  (this_00,&pageAllocator->super_PageAllocator), bVar8)) {
              bVar8 = Recycler::NeedOOMRescan(recycler);
              if ((!bVar8) && ((char *)0xfff < pcVar18)) {
                uVar12 = (ulong)pcVar18 >> 0xc;
                pcVar21 = (char *)0x0;
                do {
                  if (pcVar18 <= pcVar21) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar10 = 1;
                    bVar8 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                       ,0x3f6,
                                       "((size_t)(pageAddress - segmentStart) < segmentLength)",
                                       "(size_t)(pageAddress - segmentStart) < segmentLength");
                    if (!bVar8) goto LAB_006b5eaf;
                    *puVar10 = 0;
                  }
                  pcVar20 = pcVar15 + (long)pcVar21;
                  if (this->startAddress != (char *)((ulong)pcVar20 & 0xffffffff00000000)) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar10 = 1;
                    bVar8 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                       ,0x3f9,
                                       "(HeapBlockMap64::GetNodeStartAddress(pageAddress) == this->startAddress)"
                                       ,
                                       "HeapBlockMap64::GetNodeStartAddress(pageAddress) == this->startAddress"
                                      );
                    if (!bVar8) goto LAB_006b5eaf;
                    *puVar10 = 0;
                  }
                  chunk = this->map[(ulong)pcVar20 >> 0x14 & 0xfff];
                  if (chunk == (L2MapChunk *)0x0) goto LAB_006b5cca;
                  uVar13 = (ulong)pcVar20 >> 0xc & 0xff;
                  heapBlock = (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)
                              chunk->map[uVar13];
                  if (((heapBlock ==
                        (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) ||
                      (pcVar20 !=
                       (heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
                       super_SmallHeapBlockT<MediumAllocationBlockAttributes>.super_HeapBlock.
                       address)) ||
                     ((heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
                      super_SmallHeapBlockT<MediumAllocationBlockAttributes>.super_HeapBlock.
                      needOOMRescan != true)) goto LAB_006b5cca;
                  (heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
                  super_SmallHeapBlockT<MediumAllocationBlockAttributes>.super_HeapBlock.
                  needOOMRescan = false;
                  HVar1 = chunk->blockInfo[uVar13].blockType;
                  switch(HVar1) {
                  case FreeBlockType:
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar10 = 1;
                    lineNumber = 0x40f;
                    goto LAB_006b5ded;
                  case LargeBlockTypeCount:
                  case SmallNormalBlockWithBarrierType:
                    bVar8 = RescanHeapBlockOnOOM<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
                                      (this,(SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *
                                            )heapBlock,pcVar20,HVar1,
                                       (uint)chunk->blockInfo[uVar13].bucketIndex,chunk,recycler);
                    break;
                  default:
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar10 = 1;
                    lineNumber = 0x44c;
LAB_006b5ded:
                    bVar8 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                       ,lineNumber,"(false)","false");
                    if (bVar8) {
                      *puVar10 = 0;
                      bVar7 = 0;
                      goto LAB_006b5cca;
                    }
                    goto LAB_006b5eaf;
                  case SmallFinalizableBlockType:
                  case MediumAllocBlockTypeCount:
                    bVar8 = RescanHeapBlockOnOOM<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
                                      (this,(SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>
                                             *)heapBlock,pcVar20,HVar1,
                                       (uint)chunk->blockInfo[uVar13].bucketIndex,chunk,recycler);
                    break;
                  case MediumNormalBlockType:
                  case MediumNormalBlockWithBarrierType:
                    bVar8 = RescanHeapBlockOnOOM<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
                                      (this,(SmallNormalHeapBlockT<MediumAllocationBlockAttributes>
                                             *)heapBlock,pcVar20,HVar1,
                                       (uint)chunk->blockInfo[uVar13].bucketIndex,chunk,recycler);
                    break;
                  case MediumFinalizableBlockType:
                  case MediumFinalizableBlockWithBarrierType:
                    bVar8 = RescanHeapBlockOnOOM<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
                                      (this,heapBlock,pcVar20,HVar1,
                                       (uint)chunk->blockInfo[uVar13].bucketIndex,chunk,recycler);
                  }
                  bVar7 = 0;
                  if (bVar8 == false) break;
LAB_006b5cca:
                  pcVar21 = pcVar21 + 0x1000;
                  uVar12 = uVar12 - 1;
                } while (uVar12 != 0);
              }
            }
            else {
              bVar8 = HeapInfoManager::IsRecyclerLeafPageAllocator
                                (this_00,&pageAllocator->super_PageAllocator);
              if ((!bVar8) &&
                 (bVar8 = HeapInfoManager::IsRecyclerLargeBlockPageAllocator
                                    (this_00,&pageAllocator->super_PageAllocator), !bVar8)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar10 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                                   ,0x457,
                                   "(recycler->autoHeap.IsRecyclerLeafPageAllocator(segmentPageAllocator) || recycler->autoHeap.IsRecyclerLargeBlockPageAllocator(segmentPageAllocator))"
                                   ,
                                   "recycler->autoHeap.IsRecyclerLeafPageAllocator(segmentPageAllocator) || recycler->autoHeap.IsRecyclerLargeBlockPageAllocator(segmentPageAllocator)"
                                  );
                goto joined_r0x006b59e2;
              }
            }
          }
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x100);
    }
    lVar19 = lVar19 + 1;
    if (lVar19 == 0x1000) {
      return (bool)(bVar7 | this->anyHeapBlockRescannedDuringOOM & 1U);
    }
  } while( true );
}

Assistant:

bool
HeapBlockMap32::OOMRescan(Recycler * recycler)
{
    this->anyHeapBlockRescannedDuringOOM = false;
    bool noHeapBlockNeedsRescan = true;

    // Loop through segments and find pages that need OOM Rescan.

    this->ForEachSegment(recycler, [=, &noHeapBlockNeedsRescan] (char * segmentStart, size_t segmentLength, Segment * currentSegment, PageAllocator * segmentPageAllocator) {
        Assert(segmentLength % AutoSystemInfo::PageSize == 0);

        // Process Small non-leaf segments (including write barrier blocks).
        // Large blocks have their own separate write watch handling.
        if (recycler->autoHeap.IsRecyclerPageAllocator(segmentPageAllocator)
#ifdef RECYCLER_WRITE_BARRIER
            || recycler->autoHeap.IsRecyclerWithBarrierPageAllocator(segmentPageAllocator)
#endif
            )
        {
            if (recycler->NeedOOMRescan())
            {
                // We hit OOM again.  Don't try to process any more blocks, leave them for the next OOM pass.
                return;
            }

            // Loop through pages for this segment and check OOM flag.
            size_t pageCount = segmentLength / AutoSystemInfo::PageSize;
            for (size_t i = 0; i < pageCount; i++)
            {
                char * pageAddress = segmentStart + (i * AutoSystemInfo::PageSize);
                Assert((size_t)(pageAddress - segmentStart) < segmentLength);

#if defined(TARGET_64)
                Assert(HeapBlockMap64::GetNodeStartAddress(pageAddress) == this->startAddress);
#endif

                uint id1 = GetLevel1Id(pageAddress);
                L2MapChunk * chunk = map[id1];
                if (chunk != nullptr)
                {
                    uint id2 = GetLevel2Id(pageAddress);
                    HeapBlock * heapBlock = chunk->map[id2];
                    if (heapBlock != nullptr && heapBlock->GetAddress() == pageAddress)
                    {
                        if (heapBlock->GetAndClearNeedOOMRescan())
                        {
                            noHeapBlockNeedsRescan = false;

                            HeapBlock::HeapBlockType blockType = chunk->blockInfo[id2].blockType;

                            // Determine block type and process as appropriate
                            switch (blockType)
                            {
                            case HeapBlock::HeapBlockType::FreeBlockType:
                                // Can't have a free block that has OOMRescan flag set
                                Assert(false);
                                break;

                            case HeapBlock::HeapBlockType::SmallNormalBlockType:
#ifdef RECYCLER_WRITE_BARRIER
                            case HeapBlock::HeapBlockType::SmallNormalBlockWithBarrierType:
#endif
                                if (!RescanHeapBlockOnOOM<SmallNormalHeapBlock>((SmallNormalHeapBlock*)heapBlock, pageAddress, blockType, chunk->blockInfo[id2].bucketIndex, chunk, recycler))
                                {
                                    return;
                                }
                                break;

                            case HeapBlock::HeapBlockType::SmallFinalizableBlockType:
#ifdef RECYCLER_WRITE_BARRIER
                            case HeapBlock::HeapBlockType::SmallFinalizableBlockWithBarrierType:
#endif
                                if (!RescanHeapBlockOnOOM<SmallFinalizableHeapBlock>((SmallFinalizableHeapBlock*) heapBlock, pageAddress, blockType, chunk->blockInfo[id2].bucketIndex, chunk, recycler))
                                {
                                    return;
                                }
                                break;
#ifdef RECYCLER_VISITED_HOST
                            case HeapBlock::HeapBlockType::SmallRecyclerVisitedHostBlockType:
                                if (!RescanHeapBlockOnOOM<SmallRecyclerVisitedHostHeapBlock>((SmallRecyclerVisitedHostHeapBlock*) heapBlock, pageAddress, blockType, chunk->blockInfo[id2].bucketIndex, chunk, recycler))
                                {
                                    return;
                                }
                                break;
#endif

                            case HeapBlock::HeapBlockType::MediumNormalBlockType:
#ifdef RECYCLER_WRITE_BARRIER
                            case HeapBlock::HeapBlockType::MediumNormalBlockWithBarrierType:
#endif
                                if (!RescanHeapBlockOnOOM<MediumNormalHeapBlock>((MediumNormalHeapBlock*)heapBlock, pageAddress, blockType, chunk->blockInfo[id2].bucketIndex, chunk, recycler))
                                {
                                    return;
                                }
                                break;

                            case HeapBlock::HeapBlockType::MediumFinalizableBlockType:
#ifdef RECYCLER_WRITE_BARRIER
                            case HeapBlock::HeapBlockType::MediumFinalizableBlockWithBarrierType:
#endif
                                if (!RescanHeapBlockOnOOM<MediumFinalizableHeapBlock>((MediumFinalizableHeapBlock*) heapBlock, pageAddress, blockType, chunk->blockInfo[id2].bucketIndex, chunk, recycler))
                                {
                                    return;
                                }
                                break;
#ifdef RECYCLER_VISITED_HOST
                            case HeapBlock::HeapBlockType::MediumRecyclerVisitedHostBlockType:
                                if (!RescanHeapBlockOnOOM<MediumRecyclerVisitedHostHeapBlock>((MediumRecyclerVisitedHostHeapBlock*) heapBlock, pageAddress, blockType, chunk->blockInfo[id2].bucketIndex, chunk, recycler))
                                {
                                    return;
                                }
                                break;
#endif

                            default:
                                // Shouldn't be here -- leaf blocks aren't rescanned, and large blocks are handled separately
                                Assert(false);
                                break;
                            }
                        }
                    }
                }
            }
        }
        else
        {
            Assert(recycler->autoHeap.IsRecyclerLeafPageAllocator(segmentPageAllocator) ||
                recycler->autoHeap.IsRecyclerLargeBlockPageAllocator(segmentPageAllocator));
        }
    });

    // TODO: Enable this assert post-Win10
    // Assert(this->anyHeapBlockRescannedDuringOOM);
    // Success if:
    //  No heap block needs OOM rescan OR
    //  A single heap block was rescanned
    return noHeapBlockNeedsRescan || this->anyHeapBlockRescannedDuringOOM;
}